

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::MergeF0
               (double **multi_channel_f0,int *boundary_list,int number_of_channels,int f0_length,
               double **f0_candidates,double **f0_scores,int number_of_candidates,double *merged_f0)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  int *order_00;
  int in_ECX;
  int in_EDX;
  double *unaff_RBX;
  double **in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  long in_stack_00000010;
  int j;
  int i_1;
  int i;
  int *order;
  double *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int iVar4;
  int iVar5;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_EDX;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  order_00 = (int *)operator_new__(uVar3);
  MakeSortedOrder((int *)in_RSI,in_EDX,order_00);
  for (iVar5 = 0; iVar5 < in_ECX; iVar5 = iVar5 + 1) {
    *(undefined8 *)(in_stack_00000010 + (long)iVar5 * 8) =
         *(undefined8 *)(*in_RDI + (long)iVar5 * 8);
  }
  for (iVar4 = 1; iVar4 < in_EDX; iVar4 = iVar4 + 1) {
    if (*(int *)((long)in_RSI + (long)(order_00[iVar4] << 1) * 4) - *(int *)((long)in_RSI + 4) < 1)
    {
      iVar2 = MergeF0Sub((double *)CONCAT44(iVar5,iVar4),in_stack_ffffffffffffffb4,
                         in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                         in_stack_ffffffffffffffa0,(int)((ulong)in_stack_00000010 >> 0x20),
                         (int)in_R8,(double **)CONCAT44(in_EDX,in_ECX),in_RSI,(int)in_RDI,unaff_RBX)
      ;
      *(int *)((long)in_RSI + 4) = iVar2;
    }
    else {
      for (in_stack_ffffffffffffffb4 = *(int *)((long)in_RSI + (long)(order_00[iVar4] << 1) * 4);
          in_stack_ffffffffffffffb4 <= *(int *)((long)in_RSI + (long)(order_00[iVar4] * 2 + 1) * 4);
          in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
        *(undefined8 *)(in_stack_00000010 + (long)in_stack_ffffffffffffffb4 * 8) =
             *(undefined8 *)(in_RDI[order_00[iVar4]] + (long)in_stack_ffffffffffffffb4 * 8);
      }
      *(undefined4 *)in_RSI = *(undefined4 *)((long)in_RSI + (long)(order_00[iVar4] << 1) * 4);
      *(undefined4 *)((long)in_RSI + 4) =
           *(undefined4 *)((long)in_RSI + (long)(order_00[iVar4] * 2 + 1) * 4);
    }
  }
  if (order_00 != (int *)0x0) {
    operator_delete__(order_00);
  }
  return;
}

Assistant:

static void MergeF0(const double * const *multi_channel_f0, int *boundary_list,
    int number_of_channels, int f0_length, const double * const *f0_candidates,
    const double * const *f0_scores, int number_of_candidates,
    double *merged_f0) {
  int *order = new int[number_of_channels];
  MakeSortedOrder(boundary_list, number_of_channels, order);

  for (int i = 0; i < f0_length; ++i)
    merged_f0[i] = multi_channel_f0[0][i];

  for (int i = 1; i < number_of_channels; ++i)
    if (boundary_list[order[i] * 2] - boundary_list[1] > 0) {
      for (int j = boundary_list[order[i] * 2];
        j <= boundary_list[order[i] * 2 + 1]; ++j)
        merged_f0[j] = multi_channel_f0[order[i]][j];
      boundary_list[0] = boundary_list[order[i] * 2];
      boundary_list[1] = boundary_list[order[i] * 2 + 1];
    } else {
      boundary_list[1] =
        MergeF0Sub(merged_f0, f0_length, boundary_list[0], boundary_list[1],
        multi_channel_f0[order[i]], boundary_list[order[i] * 2],
        boundary_list[order[i] * 2 + 1], f0_candidates, f0_scores,
        number_of_candidates, merged_f0);
    }

  delete[] order;
}